

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O0

NodeData __thiscall
google::protobuf::compiler::
SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::DFS
          (SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator> *this,
          Descriptor *descriptor)

{
  int iVar1;
  Descriptor *pDVar2;
  bool bVar3;
  size_type sVar4;
  reference ppDVar5;
  LogMessage *pLVar6;
  int *piVar7;
  reference ppDVar8;
  mapped_type *pmVar9;
  iterator iVar10;
  iterator iVar11;
  NodeData NVar12;
  value_type local_130;
  Descriptor *scc_desc;
  SCC *scc;
  NodeData child_data_1;
  NodeData child_data;
  LogMessage local_f8;
  Descriptor *local_c0;
  Descriptor *dep;
  iterator __end0;
  iterator __begin0;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  local_a0;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *local_88;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *__range3;
  NodeData *result;
  byte local_61;
  LogMessage local_60;
  Descriptor *local_28;
  Descriptor *descriptor_local;
  SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator> *this_local;
  
  local_28 = descriptor;
  descriptor_local = (Descriptor *)this;
  sVar4 = std::
          map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData>_>_>
          ::count(&this->cache_,&local_28);
  local_61 = 0;
  if (sVar4 != 0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/scc.h"
               ,0x5c);
    local_61 = 1;
    pLVar6 = internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: (cache_.count(descriptor)) == (0): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&result + 3),pLVar6);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  __range3 = (vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              *)std::
                map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData>_>_>
                ::operator[](&this->cache_,&local_28);
  iVar1 = this->index_;
  this->index_ = iVar1 + 1;
  ((mapped_type *)__range3)->lowlink = iVar1;
  ((mapped_type *)__range3)->index = iVar1;
  std::
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::push_back(&this->stack_,&local_28);
  cpp::MessageSCCAnalyzer::DepsGenerator::operator()
            (&local_a0,(DepsGenerator *)((long)&__begin0._M_current + 7),local_28);
  local_88 = &local_a0;
  __end0 = std::
           vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
           ::begin(local_88);
  dep = (Descriptor *)
        std::
        vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ::end(local_88);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_google::protobuf::Descriptor_**,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
                                     *)&dep), bVar3) {
    ppDVar5 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::Descriptor_**,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
              ::operator*(&__end0);
    local_c0 = *ppDVar5;
    child_data.lowlink._3_1_ = 0;
    if (local_c0 == (Descriptor *)0x0) {
      internal::LogMessage::LogMessage
                (&local_f8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/scc.h"
                 ,0x66);
      child_data.lowlink._3_1_ = 1;
      pLVar6 = internal::LogMessage::operator<<(&local_f8,"CHECK failed: dep: ");
      internal::LogFinisher::operator=((LogFinisher *)((long)&child_data.lowlink + 2),pLVar6);
    }
    if ((child_data.lowlink._3_1_ & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_f8);
    }
    sVar4 = std::
            map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData>_>_>
            ::count(&this->cache_,&local_c0);
    if (sVar4 == 0) {
      NVar12 = DFS(this,local_c0);
      child_data.scc = NVar12._8_8_;
      child_data_1._8_8_ = NVar12.scc;
      piVar7 = std::min<int>((int *)((long)&(__range3->
                                            super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                            )._M_impl.super__Vector_impl_data._M_finish + 4),
                             (int *)((long)&child_data.scc + 4));
      *(int *)((long)&(__range3->
                      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish + 4) = *piVar7;
    }
    else {
      pmVar9 = std::
               map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData>_>_>
               ::operator[](&this->cache_,&local_c0);
      scc = pmVar9->scc;
      child_data_1.scc = *(SCC **)&pmVar9->index;
      if (scc == (SCC *)0x0) {
        piVar7 = std::min<int>((int *)((long)&(__range3->
                                              super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                              )._M_impl.super__Vector_impl_data._M_finish + 4),
                               (int *)&child_data_1);
        *(int *)((long)&(__range3->
                        super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish + 4) = *piVar7;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::Descriptor_**,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
    ::operator++(&__end0);
  }
  std::
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~vector(&local_a0);
  if (*(int *)&(__range3->
               super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_finish ==
      *(int *)((long)&(__range3->
                      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish + 4)) {
    scc_desc = (Descriptor *)CreateSCC(this);
    do {
      ppDVar8 = std::
                vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                ::back(&this->stack_);
      local_130 = *ppDVar8;
      std::
      vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::push_back((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   *)scc_desc,&local_130);
      std::
      vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::pop_back(&this->stack_);
      pDVar2 = scc_desc;
      pmVar9 = std::
               map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData>_>_>
               ::operator[](&this->cache_,&local_130);
      pmVar9->scc = (SCC *)pDVar2;
    } while (local_130 != local_28);
    iVar10 = std::
             vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
             ::begin((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      *)scc_desc);
    iVar11 = std::
             vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
             ::end((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    *)scc_desc);
    std::
    sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor_const**,std::vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>>,google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::DFS(google::protobuf::Descriptor_const*)::_lambda(google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*)_1_>
              (iVar10._M_current,iVar11._M_current);
    AddChildren(this,(SCC *)scc_desc);
  }
  return *(NodeData *)
          &(__range3->
           super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
           )._M_impl.super__Vector_impl_data;
}

Assistant:

NodeData DFS(const Descriptor* descriptor) {
    // Must not have visited already.
    GOOGLE_DCHECK_EQ(cache_.count(descriptor), 0);

    // Mark visited by inserting in map.
    NodeData& result = cache_[descriptor];
    // Initialize data structures.
    result.index = result.lowlink = index_++;
    stack_.push_back(descriptor);

    // Recurse the fields / nodes in graph
    for (auto dep : DepsGenerator()(descriptor)) {
      GOOGLE_CHECK(dep);
      if (cache_.count(dep) == 0) {
        // unexplored node
        NodeData child_data = DFS(dep);
        result.lowlink = std::min(result.lowlink, child_data.lowlink);
      } else {
        NodeData child_data = cache_[dep];
        if (child_data.scc == nullptr) {
          // Still in the stack_ so we found a back edge
          result.lowlink = std::min(result.lowlink, child_data.index);
        }
      }
    }
    if (result.index == result.lowlink) {
      // This is the root of a strongly connected component
      SCC* scc = CreateSCC();
      while (true) {
        const Descriptor* scc_desc = stack_.back();
        scc->descriptors.push_back(scc_desc);
        // Remove from stack
        stack_.pop_back();
        cache_[scc_desc].scc = scc;

        if (scc_desc == descriptor) break;
      }

      // The order of descriptors is random and depends how this SCC was
      // discovered. In-order to ensure maximum stability we sort it by name.
      std::sort(scc->descriptors.begin(), scc->descriptors.end(),
                [](const Descriptor* a, const Descriptor* b) {
                  return a->full_name() < b->full_name();
                });
      AddChildren(scc);
    }
    return result;
  }